

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Maybe<kj::Promise<unsigned_long>_> __thiscall
kj::anon_unknown_123::AsyncPipe::tryPumpFrom
          (AsyncPipe *this,AsyncInputStream *input,uint64_t amount)

{
  _func_int **pp_Var1;
  int iVar2;
  void *pvVar3;
  long in_RCX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_01;
  Maybe<kj::Promise<unsigned_long>_> MVar4;
  
  if (in_RCX == 0) {
    if (_ZGVZN2kj12constPromiseImTnT_Lm0EEENS_7PromiseIS1_EEvE4NODE == '\0') {
      iVar2 = __cxa_guard_acquire(&_ZGVZN2kj12constPromiseImTnT_Lm0EEENS_7PromiseIS1_EEvE4NODE);
      amount = (uint64_t)extraout_RDX_00;
      if (iVar2 != 0) {
        kj::_::ImmediatePromiseNodeBase::ImmediatePromiseNodeBase
                  ((ImmediatePromiseNodeBase *)
                   _ZZN2kj12constPromiseImTnT_Lm0EEENS_7PromiseIS1_EEvE4NODE);
        _ZZN2kj12constPromiseImTnT_Lm0EEENS_7PromiseIS1_EEvE4NODE._0_8_ = &PTR_destroy_006da750;
        __cxa_atexit(kj::_::ImmediatePromiseNodeBase::~ImmediatePromiseNodeBase,
                     _ZZN2kj12constPromiseImTnT_Lm0EEENS_7PromiseIS1_EEvE4NODE,&__dso_handle);
        __cxa_guard_release(&_ZGVZN2kj12constPromiseImTnT_Lm0EEENS_7PromiseIS1_EEvE4NODE);
        amount = (uint64_t)extraout_RDX_01;
      }
    }
    *(undefined1 *)
     &(this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
      _vptr_AsyncInputStream = 1;
    (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
    _vptr_AsyncOutputStream =
         (_func_int **)_ZZN2kj12constPromiseImTnT_Lm0EEENS_7PromiseIS1_EEvE4NODE;
  }
  else {
    pp_Var1 = input[4]._vptr_AsyncInputStream;
    if (pp_Var1 == (_func_int **)0x0) {
      pvVar3 = operator_new(0x400);
      *(undefined8 *)((long)pvVar3 + 0x1f8) = 0;
      *(undefined ***)((long)pvVar3 + 0x1e8) = &PTR_destroy_006df868;
      *(undefined ***)((long)pvVar3 + 0x200) = &PTR_reject_006df8b8;
      *(undefined1 *)((long)pvVar3 + 0x208) = 0;
      *(undefined1 *)((long)pvVar3 + 0x3a0) = 0;
      *(undefined1 *)((long)pvVar3 + 0x3b0) = 1;
      *(undefined ***)((long)pvVar3 + 0x3b8) = &PTR_read_006df918;
      *(undefined ***)((long)pvVar3 + 0x3c0) = &PTR_write_006df9d8;
      *(uint64_t *)((long)pvVar3 + 0x3c8) = (long)pvVar3 + 0x200U;
      *(AsyncInputStream **)((long)pvVar3 + 0x3d0) = input;
      *(uint64_t *)((long)pvVar3 + 0x3d8) = amount;
      *(long *)((long)pvVar3 + 0x3e0) = in_RCX;
      *(undefined8 *)((long)pvVar3 + 1000) = 0;
      *(undefined8 *)((long)pvVar3 + 0x3f0) = 0;
      *(undefined8 *)((long)pvVar3 + 0x3f8) = 0;
      input[4]._vptr_AsyncInputStream = (_func_int **)((long)pvVar3 + 0x3b8);
      *(void **)((long)pvVar3 + 0x1f0) = pvVar3;
      *(undefined1 *)
       &(this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
        _vptr_AsyncInputStream = 1;
      (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
      _vptr_AsyncOutputStream = (_func_int **)((long)pvVar3 + 0x1e8);
      amount = (long)pvVar3 + 0x200U;
    }
    else {
      (**(code **)(pp_Var1[1] + 0x10))(this,pp_Var1 + 1,amount);
      amount = (uint64_t)extraout_RDX;
    }
  }
  MVar4.ptr.field_1 =
       (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2)amount;
  MVar4.ptr._0_8_ = this;
  return (Maybe<kj::Promise<unsigned_long>_>)MVar4.ptr;
}

Assistant:

Maybe<Promise<uint64_t>> tryPumpFrom(
      AsyncInputStream& input, uint64_t amount) override {
    if (amount == 0) {
      return constPromise<uint64_t, 0>();
    } else KJ_IF_SOME(s, state) {
      return s.tryPumpFrom(input, amount);
    } else {
      return newAdaptedPromise<uint64_t, BlockedPumpFrom>(*this, input, amount);
    }
  }